

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O0

bool __thiscall crnlib::vec<6U,_float>::operator<(vec<6U,_float> *this,vec<6U,_float> *rhs)

{
  uint local_24;
  uint i;
  vec<6U,_float> *rhs_local;
  vec<6U,_float> *this_local;
  
  local_24 = 0;
  while( true ) {
    if (5 < local_24) {
      return false;
    }
    if (this->m_s[local_24] < rhs->m_s[local_24]) break;
    if ((this->m_s[local_24] != rhs->m_s[local_24]) ||
       (NAN(this->m_s[local_24]) || NAN(rhs->m_s[local_24]))) {
      return false;
    }
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

inline bool operator<(const vec& rhs) const
        {
            for (uint i = 0; i < N; i++)
            {
                if (m_s[i] < rhs.m_s[i])
                {
                    return true;
                }
                else if (m_s[i] != rhs.m_s[i])
                {
                    return false;
                }
            }

            return false;
        }